

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ReverseLayerParams::SerializeWithCachedSizes
          (ReverseLayerParams *this,CodedOutputStream *output)

{
  int iVar1;
  RepeatedField<bool> *this_00;
  bool *a;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ReverseLayerParams *this_local;
  
  iVar1 = reversedim_size(this);
  if (0 < iVar1) {
    google::protobuf::internal::WireFormatLite::WriteTag(1,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_reversedim_cached_byte_size_);
    this_00 = reversedim(this);
    a = google::protobuf::RepeatedField<bool>::data(this_00);
    iVar1 = reversedim_size(this);
    google::protobuf::internal::WireFormatLite::WriteBoolArray(a,iVar1,output);
  }
  return;
}

Assistant:

void ReverseLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReverseLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated bool reverseDim = 1;
  if (this->reversedim_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_reversedim_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteBoolArray(
      this->reversedim().data(), this->reversedim_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReverseLayerParams)
}